

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

chunk_conflict * desert_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  short sVar1;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc_conflict grid_06;
  loc_conflict grid_07;
  loc_conflict grid_08;
  loc grid_09;
  loc_conflict grid_10;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  int y_00;
  int x_00;
  uint32_t uVar8;
  feature *pfVar9;
  loc_conflict lVar10;
  loc lVar11;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  wchar_t yhi;
  wchar_t ylo;
  wchar_t y;
  wchar_t xhi;
  wchar_t xlo;
  wchar_t x;
  wchar_t b;
  wchar_t a;
  chunk_conflict *c;
  loc stair;
  wchar_t form_feats [7];
  int local_50;
  int local_4c;
  wchar_t form_grids_target;
  wchar_t form_grids;
  wchar_t last_place;
  wchar_t place;
  wchar_t plats;
  wchar_t d;
  wchar_t j;
  loc grid;
  _Bool made_plat;
  char **p_error_local;
  wchar_t width_local;
  wchar_t height_local;
  player *p_local;
  
  wVar3 = (wchar_t)p->place;
  sVar1 = p->last_place;
  local_4c = 0;
  local_50 = p->depth * 0x14;
  stair.x = FEAT_GRASS;
  stair.y = FEAT_PASS_RUBBLE;
  c = (chunk_conflict *)loc(0,0);
  p_local = (player *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  *(int *)((long)&p_local->class + 4) = (int)p->depth;
  (p_local->grid).x = wVar3;
  for (j = L'\0'; j < *(wchar_t *)&p_local->ht; j = j + L'\x01') {
    for (d = L'\0'; d < p_local->au; d = d + L'\x01') {
      lVar10.y = j;
      lVar10.x = d;
      square_set_feat((chunk *)p_local,lVar10,FEAT_GRASS);
    }
  }
  alloc_paths((chunk_conflict *)p_local,p,wVar3,(int)sVar1);
  set_num_vaults((chunk_conflict *)p_local);
  make_edges((chunk_conflict *)p_local,true,false);
  if (world->levels[wVar3].down != (char *)0x0) {
    num_wild_vaults = L'\0';
    for (place = L'\0'; place < p_local->au; place = place + L'\x01') {
      for (j = L'\0'; j < place; j = j + L'\x01') {
        wVar3 = place - j;
        grid_00.y = j;
        grid_00.x = wVar3;
        _Var2 = square_in_bounds_fully((chunk *)p_local,grid_00);
        if (_Var2) {
          grid_01.y = j;
          grid_01.x = wVar3;
          pfVar9 = square_feat((chunk *)p_local,grid_01);
          if (pfVar9->fidx == FEAT_ROAD) {
            grid_02.y = j;
            grid_02.x = wVar3;
            square_set_feat((chunk *)p_local,grid_02,FEAT_MORE);
            c = (chunk_conflict *)CONCAT44(j,wVar3);
            wVar4 = level_topography((int)sVar1);
            if ((wVar4 == L'\a') || (turn < 10)) {
              lVar11.y = j;
              lVar11.x = wVar3;
              player_place((chunk_conflict1 *)p_local,p,lVar11);
            }
            break;
          }
          grid_03.y = j;
          grid_03.x = wVar3;
          square_set_feat((chunk *)p_local,grid_03,FEAT_GRANITE);
        }
      }
      if (c._4_4_ != 0) break;
    }
    local_50 = ((p_local->au * *(wchar_t *)&p_local->ht - (place * place) / 2) * local_50) /
               (p_local->au * *(wchar_t *)&p_local->ht);
  }
  for (j = L'\0'; j < *(wchar_t *)&p_local->ht; j = j + L'\x01') {
    for (d = L'\0'; d < p_local->au; d = d + L'\x01') {
      grid_04.y = j;
      grid_04.x = d;
      pfVar9 = square_feat((chunk *)p_local,grid_04);
      if (pfVar9->fidx == FEAT_GRASS) {
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          grid_05.y = j;
          grid_05.x = d;
          square_set_feat((chunk *)p_local,grid_05,FEAT_DUNE);
        }
        else {
          uVar5 = Rand_div(2);
          if (uVar5 == 0) {
            grid_06.y = j;
            grid_06.x = d;
            square_set_feat((chunk *)p_local,grid_06,FEAT_PASS_RUBBLE);
          }
          else {
            grid_07.y = j;
            grid_07.x = d;
            square_set_feat((chunk *)p_local,grid_07,FEAT_MAGMA);
          }
        }
      }
      else {
        grid_08.y = j;
        grid_08.x = d;
        square_mark((chunk *)p_local,grid_08);
      }
    }
  }
  last_place = rand_range(2,4);
  for (plats = L'\0'; plats < L'2'; plats = plats + L'\x01') {
    uVar5 = Rand_div(6);
    iVar6 = uVar5 + 4;
    uVar5 = Rand_div(5);
    iVar7 = uVar5 + 4;
    local_c0 = iVar7;
    if (iVar7 < 7) {
      local_c0 = 7;
    }
    if (*(wchar_t *)&p_local->ht + L'\xfffffff8' <
        (*(wchar_t *)&p_local->ht + L'\xffffffff') - iVar7) {
      local_c4 = *(wchar_t *)&p_local->ht + L'\xfffffff8';
    }
    else {
      local_c4 = (*(wchar_t *)&p_local->ht + L'\xffffffff') - iVar7;
    }
    y_00 = rand_range(local_c0,local_c4);
    local_c8 = iVar6;
    if (iVar6 < 10) {
      local_c8 = 10;
    }
    if (*(wchar_t *)&p_local->ht + L'\xfffffff5' < (p_local->au + L'\xffffffff') - iVar6) {
      local_cc = *(wchar_t *)&p_local->ht + L'\xfffffff5';
    }
    else {
      local_cc = (p_local->au + L'\xffffffff') - iVar6;
    }
    x_00 = rand_range(local_c8,local_cc);
    lVar10 = (loc_conflict)loc(x_00,y_00);
    _Var2 = square_isgranite((chunk *)p_local,lVar10);
    if (!_Var2) {
      lVar11 = loc(x_00,y_00);
      wVar3 = distance(lVar11,(loc)c);
      if (iVar6 + iVar7 <= wVar3) {
        _Var2 = generate_starburst_room
                          ((chunk_conflict *)p_local,y_00 - iVar7,x_00 - iVar6,y_00 + iVar7,
                           x_00 + iVar6,false,FEAT_GRASS,false);
        if (_Var2) {
          last_place = last_place + L'\xffffffff';
        }
        if (last_place == L'\0') break;
      }
    }
  }
  for (; local_4c < local_50; local_4c = wVar3 + local_4c) {
    uVar5 = Rand_div(*(wchar_t *)&p_local->ht + L'\xfffffffe');
    uVar8 = Rand_div(p_local->au + L'\xfffffffe');
    grid_09.y = uVar5 + 1;
    grid_09.x = uVar8 + 1;
    wVar3 = make_formation((chunk_conflict *)p_local,p,grid_09,FEAT_RUBBLE,FEAT_MAGMA,&stair.x,
                           "Desert",*(wchar_t *)((long)&p_local->class + 4));
  }
  for (j = L'\0'; j < *(wchar_t *)&p_local->ht; j = j + L'\x01') {
    for (d = L'\0'; d < p_local->au; d = d + L'\x01') {
      grid_10.y = j;
      grid_10.x = d;
      square_unmark((chunk *)p_local,grid_10);
    }
  }
  populate((chunk_conflict *)p_local,false);
  _Var2 = verify_level((chunk_conflict *)p_local);
  if (!_Var2) {
    wipe_mon_list((chunk *)p_local,p);
    cave_free((chunk_conflict *)p_local);
    *p_error = "wilderness level had generation issues";
    p_local = (player *)0x0;
  }
  return (chunk_conflict *)p_local;
}

Assistant:

struct chunk *desert_gen(struct player *p, int height, int width,
						 const char **p_error)
{
	bool made_plat;

	struct loc grid;
	int j, d = 0;
	int plats;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int form_grids_target = p->depth * 20;

	int form_feats[] = { FEAT_GRASS, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_DUNE, FEAT_QUARTZ, FEAT_NONE };
	struct loc stair = loc(0, 0);

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass so paths work */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Dungeon entrance */
	if (world->levels[place].down) {
		/* No vaults */
		num_wild_vaults = 0;

		/* Angband! */
		for (d = 0; d < c->width; d++) {
			for (grid.y = 0; grid.y < d; grid.y++) {
				grid.x = d - grid.y;
				if (!square_in_bounds_fully(c, grid))
					continue;
				if (square_feat(c, grid)->fidx == FEAT_ROAD) {
					/* The gate of Angband */
					square_set_feat(c, grid, FEAT_MORE);
					stair = grid;
					if (level_topography(last_place) == TOP_CAVE || turn < 10)
						player_place(c, p, grid);
					break;
				} else {
					/* The walls of Thangorodrim */
					square_set_feat(c, grid, FEAT_GRANITE);
				}
			}
			if (stair.y)
				break;
		}

		/* Adjust formation grids for how much of the level is removed */
		form_grids_target *= (c->width * c->height - (d * d / 2));
		form_grids_target /= (c->width * c->height);
	}

	/* Now place rubble, sand and magma */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create desert */
			if (square_feat(c, grid)->fidx == FEAT_GRASS) {
				if (one_in_(2))
					square_set_feat(c, grid, FEAT_DUNE);
				else if (one_in_(2))
					square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(c, grid, FEAT_MAGMA);
			} else
				/* Prepare for clearings */
				square_mark(c, grid);
		}
	}

	/* Make a few clearings */
	plats = rand_range(2, 4);

	/* Try fairly hard */
	for (j = 0; j < 50; j++) {
		int a, b, x, xlo, xhi, y, ylo, yhi;

		/*
		 * Try for a clearing.  Constrain the center choice so the
		 * bounding box is in bounds and the center won't be within
		 * the maximum possible extent of the walls created by
		 * make_edges() (that's to avoid a room that's entirely
		 * surrounded by those walls).
		 */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		ylo = MAX(b, 7);
		yhi = MIN(c->height - 1 - b, c->height - 8);
		y = rand_range(ylo, yhi);
		xlo = MAX(a, 10);
		xhi = MIN(c->width - 1 - a, c->height - 11);
		x = rand_range(xlo, xhi);
		if (square_isgranite(c, loc(x, y))) continue;
		if (distance(loc(x, y), stair) < a + b) continue;
		made_plat = generate_starburst_room(c, y - b, x - a, y + b, x + a,
											false, FEAT_GRASS, false);

		/* Success ? */
		if (made_plat)
			plats--;

		/* Done ? */
		if (!plats)
			break;
	}

	/* Place some formations */
	while (form_grids < form_grids_target) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_RUBBLE, FEAT_MAGMA,
									 form_feats, "Desert", c->depth);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}